

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O3

void __thiscall
dap::ResponseOrError<dap::CMakeInitializeResponse>::~ResponseOrError
          (ResponseOrError<dap::CMakeInitializeResponse> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->error).message._M_dataplus._M_p;
  paVar1 = &(this->error).message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->response).cmakeVersion.full._M_dataplus._M_p;
  paVar1 = &(this->response).cmakeVersion.full.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->response).cmakeVersion.super_InitializeResponse.supportedChecksumAlgorithms.val)
  ;
  std::vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>::
  ~vector(&(this->response).cmakeVersion.super_InitializeResponse.exceptionBreakpointFilters.val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->response).cmakeVersion.super_InitializeResponse.completionTriggerCharacters.val)
  ;
  std::vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>::~vector
            ((vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_> *)
             &(this->response).cmakeVersion);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->response).supportedChecksumAlgorithms.val);
  std::vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>::
  ~vector(&(this->response).exceptionBreakpointFilters.val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->response).completionTriggerCharacters.val);
  std::vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>::~vector
            ((vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_> *)this);
  return;
}

Assistant:

inline ResponseOrError() = default;